

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

void __thiscall
lzham::lzham_decompressor::lzham_decompressor
          (lzham_decompressor *this,lzham_malloc_context malloc_context)

{
  adaptive_bit_model *paVar1;
  ulong uVar2;
  quasi_adaptive_huffman_data_model *this_00;
  long lVar3;
  
  this->m_malloc_context = malloc_context;
  symbol_codec::symbol_codec(&this->m_codec,malloc_context);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_lit_table,malloc_context,false,0,0,0);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_delta_lit_table,malloc_context,false,0,0,0);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_main_table,malloc_context,false,0,0,0);
  this_00 = (quasi_adaptive_huffman_data_model *)&this->field_0x318;
  lVar3 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)((long)this_00 + lVar3),
               (lzham_malloc_context)0x0,false,0,0,0);
    lVar3 = lVar3 + 0x90;
  } while (lVar3 != 0x120);
  lVar3 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x438 + lVar3),
               (lzham_malloc_context)0x0,false,0,0,0);
    lVar3 = lVar3 + 0x90;
  } while (lVar3 != 0x120);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_dist_lsb_table,malloc_context,false,0,0,0);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_match_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_rep_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_rep0_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_rep0_single_byte_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_rep1_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  uVar2 = 0;
  do {
    if (uVar2 < 0xc) {
      paVar1 = this->m_is_rep2_model + uVar2;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar2 = uVar2 + 4;
  } while (uVar2 != 0xc);
  lVar3 = 1;
  do {
    quasi_adaptive_huffman_data_model::set_malloc_context(this_00,malloc_context);
    quasi_adaptive_huffman_data_model::set_malloc_context(this_00 + 2,malloc_context);
    this_00 = this_00 + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 == 0);
  return;
}

Assistant:

lzham_decompressor(lzham_malloc_context malloc_context) : 
         m_malloc_context(malloc_context),
         m_codec(malloc_context),
         m_lit_table(malloc_context),
         m_delta_lit_table(malloc_context),
         m_main_table(malloc_context),
         m_dist_lsb_table(malloc_context)
      {
         for (uint i = 0; i < 2; i++)
         {
            m_rep_len_table[i].set_malloc_context(malloc_context);
            m_large_len_table[i].set_malloc_context(malloc_context);
         }
      }